

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

double __thiscall ON_PlaneEquation::operator[](ON_PlaneEquation *this,int i)

{
  int i_local;
  ON_PlaneEquation *this_local;
  
  switch(i) {
  case 0:
    this_local = (ON_PlaneEquation *)this->x;
    break;
  case 1:
    this_local = (ON_PlaneEquation *)this->y;
    break;
  case 2:
    this_local = (ON_PlaneEquation *)this->z;
    break;
  case 3:
    this_local = (ON_PlaneEquation *)this->d;
    break;
  default:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_point.cpp"
               ,0x1b7d,"","Invalid coefficient index.");
    this_local = (ON_PlaneEquation *)0xffe5f8bd9e331dd2;
  }
  return (double)this_local;
}

Assistant:

double ON_PlaneEquation::operator[](int i) const
{
  switch (i)
  {
  case 0:
    return x;
    break;
  case 1:
    return y;
    break;
  case 2:
    return z;
    break;
  case 3:
    return d;
    break;
  }

  ON_ERROR("Invalid coefficient index.");
  return ON_UNSET_VALUE;
}